

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

uint __thiscall
Js::EntryPointInfo::PopulateLineInfo(EntryPointInfo *this,void *pInfo,FunctionBody *body)

{
  uint uVar1;
  int iVar2;
  SRCINFO *pSVar3;
  ULONG UVar4;
  NativeEntryPointData *pNVar5;
  Type *pTVar6;
  uint uVar7;
  int iVar8;
  uint32 statementIndex;
  int index;
  uint uVar9;
  
  pNVar5 = GetNativeEntryPointData(this);
  uVar1 = (body->super_ParseableFunctionInfo).m_lineNumber;
  pSVar3 = (((body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
           m_srcInfo).ptr;
  uVar7 = pSVar3->lnMinHost;
  index = 0;
  if (uVar1 < uVar7) {
    uVar7 = 0;
  }
  iVar8 = ((uVar1 + pSVar3->dlnHost) - uVar7) + 1;
  *(undefined4 *)pInfo = 0;
  *(int *)((long)pInfo + 4) = iVar8;
  iVar2 = (pNVar5->nativeOffsetMaps).
          super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          .count;
  if (iVar2 < 1) {
    uVar9 = 1;
  }
  else {
    uVar9 = 1;
    do {
      pTVar6 = JsUtil::
               List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(&pNVar5->nativeOffsetMaps,index);
      statementIndex = pTVar6->statementIndex;
      if (statementIndex == 0) {
        *(Type *)((long)pInfo + (long)(int)uVar9 * 8) = (pTVar6->nativeOffsetSpan).begin;
        *(int *)((long)pInfo + (long)(int)uVar9 * 8 + 4) = iVar8;
        uVar9 = uVar9 + 1;
        statementIndex = 0;
      }
      UVar4 = FunctionBody::GetSourceLineNumber(body,statementIndex);
      if (UVar4 != 0) {
        *(Type *)((long)pInfo + (long)(int)uVar9 * 8) = (pTVar6->nativeOffsetSpan).end;
        *(ULONG *)((long)pInfo + (long)(int)uVar9 * 8 + 4) = UVar4;
        uVar9 = uVar9 + 1;
      }
      index = index + 1;
    } while (iVar2 != index);
  }
  return uVar9;
}

Assistant:

uint EntryPointInfo::PopulateLineInfo(void* pInfo, FunctionBody* body)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        LineNumberInfo* pLineInfo = (LineNumberInfo*)pInfo;
        ULONG functionLineNumber = body->GetLineNumber();
        pLineInfo[0].Offset = 0;
        pLineInfo[0].LineNumber = functionLineNumber;

        int lineNumber = 0;
        int j = 1; // start with 1 since offset 0 has already been populated with function line number
        int count = nativeOffsetMaps.Count();
        for(int i = 0; i < count; i++)
        {
            const NativeEntryPointData::NativeOffsetMap* map = &nativeOffsetMaps.Item(i);
            uint32 statementIndex = map->statementIndex;
            if (statementIndex == 0)
            {
                // statementIndex is 0, first line in the function, populate with function line number
                pLineInfo[j].Offset = map->nativeOffsetSpan.begin;
                pLineInfo[j].LineNumber = functionLineNumber;
                j++;
            }

            lineNumber = body->GetSourceLineNumber(statementIndex);
            if (lineNumber != 0)
            {
                pLineInfo[j].Offset = map->nativeOffsetSpan.end;
                pLineInfo[j].LineNumber = lineNumber;
                j++;
            }
        }

        return j;
    }